

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

char * rv_alloc(int i)

{
  Bigint *pBVar1;
  int *r;
  int local_18;
  int k;
  int j;
  int i_local;
  
  r._4_4_ = 0;
  for (local_18 = 4; (long)local_18 + 0x18U <= (ulong)(uint)i; local_18 = local_18 << 1) {
    r._4_4_ = r._4_4_ + 1;
  }
  pBVar1 = Balloc(r._4_4_);
  if (pBVar1 == (Bigint *)0x0) {
    _j = (char *)0x0;
  }
  else {
    *(int *)&pBVar1->next = r._4_4_;
    _j = (char *)((long)&pBVar1->next + 4);
  }
  return _j;
}

Assistant:

static char *
rv_alloc(int i)
{
    int j, k, *r;

    j = sizeof(ULong);
    for(k = 0;
        sizeof(Bigint) - sizeof(ULong) - sizeof(int) + j <= (unsigned)i;
        j <<= 1)
        k++;
    r = (int*)Balloc(k);
    if (r == NULL)
        return NULL;
    *r = k;
    return (char *)(r+1);
}